

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

void lzh_decode_free(lzh_stream *strm)

{
  lzh_stream *strm_local;
  
  if (strm->ds != (lzh_dec *)0x0) {
    free(strm->ds->w_buff);
    lzh_huffman_free(&strm->ds->lt);
    lzh_huffman_free(&strm->ds->pt);
    free(strm->ds);
    strm->ds = (lzh_dec *)0x0;
  }
  return;
}

Assistant:

static void
lzh_decode_free(struct lzh_stream *strm)
{

	if (strm->ds == NULL)
		return;
	free(strm->ds->w_buff);
	lzh_huffman_free(&(strm->ds->lt));
	lzh_huffman_free(&(strm->ds->pt));
	free(strm->ds);
	strm->ds = NULL;
}